

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStructTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Functional::ShaderStructCase::init(ShaderStructCase *this,EVP_PKEY_CTX *ctx)

{
  pointer *ppTVar1;
  WrapMode WVar2;
  int iVar3;
  Texture2D *tex2D;
  long lVar4;
  TextureBinding *pTVar5;
  byte bVar6;
  TextureBinding local_90;
  Sampler local_44;
  
  bVar6 = 0;
  if (this->m_usesTexture == true) {
    local_90._0_8_ = "data/brick.png";
    tex2D = glu::Texture2D::create
                      ((this->super_ShaderRenderCase).m_renderCtx,
                       (this->super_ShaderRenderCase).m_ctxInfo,
                       ((this->super_ShaderRenderCase).super_TestCase.super_TestNode.m_testCtx)->
                       m_curArchive,1,(char **)&local_90);
    this->m_brickTexture = tex2D;
    local_44.wrapS = CLAMP_TO_EDGE;
    local_44.wrapT = CLAMP_TO_EDGE;
    local_44.wrapR = CLAMP_TO_EDGE;
    local_44.minFilter = LINEAR;
    local_44.magFilter = LINEAR;
    local_44.lodThreshold = 0.0;
    local_44.normalizedCoords = true;
    local_44.depthStencilMode = MODE_DEPTH;
    local_44.compare = COMPAREMODE_NONE;
    local_44.compareChannel = 0;
    local_44.borderColor.v.uData[0]._0_1_ = 0;
    local_44.borderColor.v._1_7_ = 0;
    local_44.borderColor.v.uData[2]._0_1_ = 0;
    local_44._45_8_ = 0;
    deqp::gls::TextureBinding::TextureBinding(&local_90,tex2D,&local_44);
    ctx = (EVP_PKEY_CTX *)
          (this->super_ShaderRenderCase).m_textures.
          super__Vector_base<deqp::gls::TextureBinding,_std::allocator<deqp::gls::TextureBinding>_>.
          _M_impl.super__Vector_impl_data._M_finish;
    if ((TextureBinding *)ctx ==
        (this->super_ShaderRenderCase).m_textures.
        super__Vector_base<deqp::gls::TextureBinding,_std::allocator<deqp::gls::TextureBinding>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<deqp::gls::TextureBinding,_std::allocator<deqp::gls::TextureBinding>_>::
      _M_realloc_insert<deqp::gls::TextureBinding>
                (&(this->super_ShaderRenderCase).m_textures,(iterator)ctx,&local_90);
    }
    else {
      pTVar5 = &local_90;
      for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
        WVar2 = (pTVar5->m_sampler).wrapS;
        ((TextureBinding *)ctx)->m_type = pTVar5->m_type;
        (((TextureBinding *)ctx)->m_sampler).wrapS = WVar2;
        pTVar5 = (TextureBinding *)((long)pTVar5 + (ulong)bVar6 * -0x10 + 8);
        ctx = (EVP_PKEY_CTX *)((long)ctx + (ulong)bVar6 * -0x10 + 8);
      }
      ppTVar1 = &(this->super_ShaderRenderCase).m_textures.
                 super__Vector_base<deqp::gls::TextureBinding,_std::allocator<deqp::gls::TextureBinding>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppTVar1 = *ppTVar1 + 1;
      ctx = (EVP_PKEY_CTX *)pTVar5;
    }
  }
  iVar3 = deqp::gls::ShaderRenderCase::init(&this->super_ShaderRenderCase,ctx);
  return iVar3;
}

Assistant:

void ShaderStructCase::init (void)
{
	if (m_usesTexture)
	{
		m_brickTexture = glu::Texture2D::create(m_renderCtx, m_ctxInfo, m_testCtx.getArchive(), "data/brick.png");
		m_textures.push_back(TextureBinding(m_brickTexture, tcu::Sampler(tcu::Sampler::CLAMP_TO_EDGE, tcu::Sampler::CLAMP_TO_EDGE, tcu::Sampler::CLAMP_TO_EDGE,
																		 tcu::Sampler::LINEAR, tcu::Sampler::LINEAR)));
		DE_ASSERT(m_textures.size() == 1);
	}
	gls::ShaderRenderCase::init();
}